

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hulog.cpp
# Opt level: O1

void log_print_callstack(FILE *f,int callstack_depth,void **callstack)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  _Rb_tree_header *p_Var4;
  char *__s;
  size_t sVar5;
  mapped_type *pmVar6;
  _Base_ptr p_Var7;
  ulong uVar8;
  uint __len;
  _Base_ptr p_Var9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  int status;
  string __str;
  string symbol;
  Dl_info dlinfo;
  int local_a4;
  undefined2 *local_a0;
  undefined8 local_98;
  undefined2 local_90;
  undefined1 local_8e;
  undefined1 local_8d;
  undefined1 *local_80;
  long local_78;
  undefined1 local_70 [16];
  ulong local_60;
  void *local_58;
  undefined1 local_50 [16];
  char *local_40;
  long local_38;
  
  if (callstack_depth < 1) {
    fprintf((FILE *)f,"==%d==    error: backtrace() returned empty callstack\n",(ulong)(uint)pid);
    return;
  }
  if (callstack_depth != 1) {
    uVar11 = (ulong)(uint)callstack_depth;
    uVar10 = 1;
    local_60 = uVar11;
    do {
      fprintf((FILE *)f,"==%d==    at 0x%016lx",(ulong)(uint)pid,callstack[uVar10]);
      if (hu_log_nosyms == 0) {
        local_58 = callstack[uVar10];
        local_78 = 0;
        local_70[0] = 0;
        p_Var4 = &(symbol_cache_abi_cxx11_->_M_t)._M_impl.super__Rb_tree_header;
        p_Var9 = (symbol_cache_abi_cxx11_->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var7 = &p_Var4->_M_header;
        for (; p_Var9 != (_Base_ptr)0x0;
            p_Var9 = (&p_Var9->_M_left)[*(void **)(p_Var9 + 1) < local_58]) {
          if (*(void **)(p_Var9 + 1) >= local_58) {
            p_Var7 = p_Var9;
          }
        }
        p_Var9 = &p_Var4->_M_header;
        if (((_Rb_tree_header *)p_Var7 != p_Var4) &&
           (p_Var9 = p_Var7, local_58 < *(void **)(p_Var7 + 1))) {
          p_Var9 = &p_Var4->_M_header;
        }
        local_80 = local_70;
        if ((_Rb_tree_header *)p_Var9 == p_Var4) {
          iVar3 = dladdr(local_58,local_50);
          if (local_40 != (char *)0x0 && iVar3 != 0) {
            if (*local_40 == '_') {
              local_a4 = -1;
              __s = (char *)__cxa_demangle(local_40,0,0,&local_a4);
              uVar11 = local_60;
              if (__s != (char *)0x0) {
                if (local_a4 == 0) {
                  local_a0 = &local_90;
                  sVar5 = strlen(__s);
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_a0,__s,__s + sVar5);
                  std::__cxx11::string::operator=((string *)&local_80,(string *)&local_a0);
                  if (local_a0 != &local_90) {
                    operator_delete(local_a0);
                  }
                }
                free(__s);
                uVar11 = local_60;
              }
            }
            if (local_78 == 0) {
              std::__cxx11::string::string((string *)&local_a0,local_40,(allocator *)&local_a4);
              std::__cxx11::string::operator=((string *)&local_80,(string *)&local_a0);
              if (local_a0 != &local_90) {
                operator_delete(local_a0);
              }
            }
            if (local_78 != 0) {
              local_8e = 0x20;
              local_90 = 0x2b20;
              local_98 = 3;
              local_8d = 0;
              local_a0 = &local_90;
              std::__cxx11::string::_M_append((char *)&local_80,(ulong)&local_90);
              if (local_a0 != &local_90) {
                operator_delete(local_a0);
              }
              uVar12 = (long)local_58 - local_38;
              uVar11 = -uVar12;
              if (0 < (long)uVar12) {
                uVar11 = uVar12;
              }
              __len = 1;
              if (9 < uVar11) {
                uVar8 = uVar11;
                uVar2 = 4;
                do {
                  __len = uVar2;
                  if (uVar8 < 100) {
                    __len = __len - 2;
                    goto LAB_001075b0;
                  }
                  if (uVar8 < 1000) {
                    __len = __len - 1;
                    goto LAB_001075b0;
                  }
                  if (uVar8 < 10000) goto LAB_001075b0;
                  bVar1 = 99999 < uVar8;
                  uVar8 = uVar8 / 10000;
                  uVar2 = __len + 4;
                } while (bVar1);
                __len = __len + 1;
              }
LAB_001075b0:
              local_a0 = &local_90;
              std::__cxx11::string::_M_construct
                        ((ulong)&local_a0,(char)__len - (char)((long)uVar12 >> 0x3f));
              std::__detail::__to_chars_10_impl<unsigned_long>
                        ((char *)((long)local_a0 - ((long)uVar12 >> 0x3f)),__len,uVar11);
              std::__cxx11::string::_M_append((char *)&local_80,(ulong)local_a0);
              uVar11 = local_60;
              if (local_a0 != &local_90) {
                operator_delete(local_a0);
              }
            }
          }
          pmVar6 = std::
                   map<void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<void_*>,_std::allocator<std::pair<void_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](symbol_cache_abi_cxx11_,&local_58);
          std::__cxx11::string::_M_assign((string *)pmVar6);
        }
        else {
          std::__cxx11::string::_M_assign((string *)&local_80);
        }
        fprintf((FILE *)f,": %s\n",local_80);
        if (local_80 != local_70) {
          operator_delete(local_80);
        }
      }
      else {
        fputc(10,(FILE *)f);
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 != uVar11);
  }
  return;
}

Assistant:

void log_print_callstack(FILE *f, int callstack_depth, void * const callstack[])
{
  if (callstack_depth > 0)
  {
    int i = 1;
    while (i < callstack_depth)
    {
#if UINTPTR_MAX == 0xffffffff
      fprintf(f, "==%d==    at 0x%08x", pid, (unsigned int) callstack[i]);
#else
      fprintf(f, "==%d==    at 0x%016" PRIxPTR, pid, (unsigned long) callstack[i]);
#endif

      if (hu_log_nosyms)
      {
        fprintf(f, "\n");
      }
      else
      {
        std::string symbol = addr_to_symbol(callstack[i]);
        fprintf(f, ": %s\n", symbol.c_str());
      }

      ++i;
    }
  }
  else
  {
    fprintf(f, "==%d==    error: backtrace() returned empty callstack\n", pid);
  }
}